

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench-feed.c
# Opt level: O2

void bench_db_1_semantic(void)

{
  bm_results_t res;
  
  res.iter10000 = 0;
  res.run10 = 0;
  res.run100 = 0;
  res.run1000 = 0;
  res.run10000 = 0;
  res.iter100 = 0;
  res.iter1000 = 0;
  res.run1 = 1;
  res.iter1 = bm_run_n(1,_bm_db_1);
  res.run10 = 1;
  res.iter10 = bm_run_n(10,_bm_db_1);
  bm_display_results(&res,"/ feed dir -> db parsing (semantic)");
  return;
}

Assistant:

void bench_db_1_semantic(void) {
    bm_results_t res = bm_init_results();

    bm_run_1(&res, _bm_db_1);
    bm_run_10(&res, _bm_db_1);

    bm_display_results(&res, "/ feed dir -> db parsing (semantic)");
}